

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int asl::utf16toUtf8(wchar_t *p,char *u,int n)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int *piVar6;
  byte *pbVar7;
  uint d;
  int c2;
  wchar_t c;
  char *u0;
  byte *pbStack_18;
  int n_local;
  char *u_local;
  wchar_t *p_local;
  
  u0._4_4_ = n;
  pbStack_18 = (byte *)u;
  u_local = (char *)p;
  do {
    piVar6 = (int *)(u_local + 4);
    iVar1 = *(int *)u_local;
    if (iVar1 == 0) break;
    bVar4 = (byte)iVar1;
    if (iVar1 < 0x80) {
      *pbStack_18 = bVar4;
      pbStack_18 = pbStack_18 + 1;
      u_local = (char *)piVar6;
    }
    else {
      bVar3 = (byte)(iVar1 >> 6);
      if (iVar1 < 0x800) {
        pbVar7 = pbStack_18 + 1;
        *pbStack_18 = bVar3 | 0xc0;
        pbStack_18 = pbStack_18 + 2;
        *pbVar7 = bVar4 & 0x3f | 0x80;
        u_local = (char *)piVar6;
      }
      else if ((iVar1 < 0xd800) || (0xdfff < iVar1)) {
        *pbStack_18 = (byte)(iVar1 >> 0xc) | 0xe0;
        pbVar7 = pbStack_18 + 2;
        pbStack_18[1] = bVar3 & 0x3f | 0x80;
        pbStack_18 = pbStack_18 + 3;
        *pbVar7 = bVar4 & 0x3f | 0x80;
        u_local = (char *)piVar6;
      }
      else {
        if (0xdbff < iVar1) break;
        u_local = u_local + 8;
        iVar2 = *piVar6;
        if ((iVar2 < 0xdc00) || (0xdfff < iVar2)) break;
        uVar5 = ((iVar1 + -0xd800) * 0x400 | iVar2 - 0xdc00U) + 0x10000;
        *pbStack_18 = (byte)(uVar5 >> 0x12) | 0xf0;
        pbStack_18[1] = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
        pbVar7 = pbStack_18 + 3;
        pbStack_18[2] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
        pbStack_18 = pbStack_18 + 4;
        *pbVar7 = (byte)uVar5 & 0x3f | 0x80;
      }
    }
    u0._4_4_ = u0._4_4_ + -1;
  } while (u0._4_4_ != 0);
  *pbStack_18 = 0;
  return (int)pbStack_18 - (int)u;
}

Assistant:

int utf16toUtf8(const wchar_t* p, char* u, int n)
{
	const char* u0 = u;
	while(wchar_t c = *p++) {
		if(c < 0x80) {
			*u++ = c & 0xff;
		}
		else if (c < 0x0800) {
			*u++ = (c >> 6 | 0xC0);
			*u++ = ((c & 0x3F) | 0x80);
		}
		else if (c < 0xd800 || c > 0xdfff) {
			*u++ = (c >> 12 | 0xE0);
			*u++ = ((c >> 6 & 0x3F) | 0x80);
			*u++ = ((c & 0x3F) | 0x80);
		}
		else if (c < 0xdc00) { // 1st surrogate
			int c2 = *p++;
			if (c2 < 0xdc00 || c2 > 0xdfff)
				break;
			unsigned int d = ((((unsigned int)c - 0xd800) << 10) | (c2 - 0xdc00)) + 0x10000;
			*u++ = (d >> 18 | 0xF0);
			*u++ = ((d >> 12 & 0x3F) | 0x80);
			*u++ = ((d >> 6 & 0x3F) | 0x80);
			*u++ = ((d & 0x3F) | 0x80);
		}
		else
			break;
		if (--n == 0)
			break;
	}
	*u='\0';
	return int(u - u0);
}